

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O3

void __thiscall
testing::internal::
ParameterizedTestSuiteInfo<(anonymous_namespace)::MainTestClass<void_(*)(const_unsigned_char_*,_int,_const_unsigned_char_*,_int,_unsigned_int_*,_int_*,_unsigned_int_*,_int_*,_unsigned_int_*)>_>
::AddTestPattern(ParameterizedTestSuiteInfo<(anonymous_namespace)::MainTestClass<void_(*)(const_unsigned_char_*,_int,_const_unsigned_char_*,_int,_unsigned_int_*,_int_*,_unsigned_int_*,_int_*,_unsigned_int_*)>_>
                 *this,char *test_suite_name,char *test_base_name,
                TestMetaFactoryBase<(anonymous_namespace)::TestParams<void_(*)(const_unsigned_char_*,_int,_const_unsigned_char_*,_int,_unsigned_int_*,_int_*,_unsigned_int_*,_int_*,_unsigned_int_*)>_>
                *meta_factory,CodeLocation *code_location)

{
  pointer psVar1;
  pointer psVar2;
  element_type *peVar3;
  char *pcVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var5;
  ulong uVar6;
  pointer psVar7;
  ulong uVar8;
  pointer psVar9;
  pointer psVar10;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  ulong uVar11;
  long lVar12;
  size_type __dnew;
  undefined1 *local_60;
  long local_58;
  undefined1 local_50 [16];
  int local_40;
  _func_int *local_38;
  
  peVar3 = (element_type *)operator_new(0x70);
  local_60 = local_50;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_60,meta_factory->_vptr_TestMetaFactoryBase,
             (long)meta_factory[1]._vptr_TestMetaFactoryBase +
             (long)meta_factory->_vptr_TestMetaFactoryBase);
  local_40 = *(int *)&meta_factory[4]._vptr_TestMetaFactoryBase;
  (peVar3->test_suite_base_name)._M_dataplus._M_p = (pointer)&(peVar3->test_suite_base_name).field_2
  ;
  local_38 = (_func_int *)0x14;
  pcVar4 = (char *)std::__cxx11::string::_M_create((ulong *)peVar3,(ulong)&local_38);
  (peVar3->test_suite_base_name)._M_dataplus._M_p = pcVar4;
  (peVar3->test_suite_base_name).field_2._M_allocated_capacity = (size_type)local_38;
  builtin_strncpy(pcVar4,"GetSseSum8x8QuadTest",0x14);
  (peVar3->test_suite_base_name)._M_string_length = (size_type)local_38;
  local_38[(long)(peVar3->test_suite_base_name)._M_dataplus._M_p] = (_func_int)0x0;
  std::__cxx11::string::string
            ((string *)&peVar3->test_base_name,test_suite_name,(allocator *)&local_38);
  (peVar3->test_meta_factory)._M_t.
  super___uniq_ptr_impl<testing::internal::TestMetaFactoryBase<(anonymous_namespace)::TestParams<void_(*)(const_unsigned_char_*,_int,_const_unsigned_char_*,_int,_unsigned_int_*,_int_*,_unsigned_int_*,_int_*,_unsigned_int_*)>_>,_std::default_delete<testing::internal::TestMetaFactoryBase<(anonymous_namespace)::TestParams<void_(*)(const_unsigned_char_*,_int,_const_unsigned_char_*,_int,_unsigned_int_*,_int_*,_unsigned_int_*,_int_*,_unsigned_int_*)>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_testing::internal::TestMetaFactoryBase<(anonymous_namespace)::TestParams<void_(*)(const_unsigned_char_*,_int,_const_unsigned_char_*,_int,_unsigned_int_*,_int_*,_unsigned_int_*,_int_*,_unsigned_int_*)>_>_*,_std::default_delete<testing::internal::TestMetaFactoryBase<(anonymous_namespace)::TestParams<void_(*)(const_unsigned_char_*,_int,_const_unsigned_char_*,_int,_unsigned_int_*,_int_*,_unsigned_int_*,_int_*,_unsigned_int_*)>_>_>_>
  .
  super__Head_base<0UL,_testing::internal::TestMetaFactoryBase<(anonymous_namespace)::TestParams<void_(*)(const_unsigned_char_*,_int,_const_unsigned_char_*,_int,_unsigned_int_*,_int_*,_unsigned_int_*,_int_*,_unsigned_int_*)>_>_*,_false>
       = (_Head_base<0UL,_testing::internal::TestMetaFactoryBase<(anonymous_namespace)::TestParams<void_(*)(const_unsigned_char_*,_int,_const_unsigned_char_*,_int,_unsigned_int_*,_int_*,_unsigned_int_*,_int_*,_unsigned_int_*)>_>_*,_false>
          )test_base_name;
  (peVar3->code_location).file._M_dataplus._M_p = (pointer)&(peVar3->code_location).file.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&peVar3->code_location,local_60,local_60 + local_58);
  (peVar3->code_location).line = local_40;
  p_Var5 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x18);
  p_Var5->_M_use_count = 1;
  p_Var5->_M_weak_count = 1;
  p_Var5->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_base_01074df0;
  p_Var5[1]._vptr__Sp_counted_base = (_func_int **)peVar3;
  psVar1 = (this->tests_).
           super__Vector_base<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::MainTestClass<void_(*)(const_unsigned_char_*,_int,_const_unsigned_char_*,_int,_unsigned_int_*,_int_*,_unsigned_int_*,_int_*,_unsigned_int_*)>_>::TestInfo>,_std::allocator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::MainTestClass<void_(*)(const_unsigned_char_*,_int,_const_unsigned_char_*,_int,_unsigned_int_*,_int_*,_unsigned_int_*,_int_*,_unsigned_int_*)>_>::TestInfo>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (psVar1 == (this->tests_).
                super__Vector_base<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::MainTestClass<void_(*)(const_unsigned_char_*,_int,_const_unsigned_char_*,_int,_unsigned_int_*,_int_*,_unsigned_int_*,_int_*,_unsigned_int_*)>_>::TestInfo>,_std::allocator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::MainTestClass<void_(*)(const_unsigned_char_*,_int,_const_unsigned_char_*,_int,_unsigned_int_*,_int_*,_unsigned_int_*,_int_*,_unsigned_int_*)>_>::TestInfo>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    psVar2 = (this->tests_).
             super__Vector_base<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::MainTestClass<void_(*)(const_unsigned_char_*,_int,_const_unsigned_char_*,_int,_unsigned_int_*,_int_*,_unsigned_int_*,_int_*,_unsigned_int_*)>_>::TestInfo>,_std::allocator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::MainTestClass<void_(*)(const_unsigned_char_*,_int,_const_unsigned_char_*,_int,_unsigned_int_*,_int_*,_unsigned_int_*,_int_*,_unsigned_int_*)>_>::TestInfo>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    lVar12 = (long)psVar1 - (long)psVar2;
    if (lVar12 == 0x7ffffffffffffff0) {
      std::__throw_length_error("vector::_M_realloc_insert");
    }
    uVar6 = lVar12 >> 4;
    uVar8 = 1;
    if (psVar1 != psVar2) {
      uVar8 = uVar6;
    }
    uVar11 = uVar8 + uVar6;
    if (0x7fffffffffffffe < uVar11) {
      uVar11 = 0x7ffffffffffffff;
    }
    if (CARRY8(uVar8,uVar6)) {
      uVar11 = 0x7ffffffffffffff;
    }
    psVar7 = (pointer)operator_new(uVar11 * 0x10);
    *(element_type **)((long)psVar7 + lVar12) = peVar3;
    *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)psVar7 + lVar12 + 8) = p_Var5;
    psVar10 = psVar7;
    for (psVar9 = psVar2; psVar1 != psVar9; psVar9 = psVar9 + 1) {
      peVar3 = (psVar9->
               super___shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::MainTestClass<void_(*)(const_unsigned_char_*,_int,_const_unsigned_char_*,_int,_unsigned_int_*,_int_*,_unsigned_int_*,_int_*,_unsigned_int_*)>_>::TestInfo,_(__gnu_cxx::_Lock_policy)2>
               )._M_ptr;
      p_Var5 = (psVar9->
               super___shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::MainTestClass<void_(*)(const_unsigned_char_*,_int,_const_unsigned_char_*,_int,_unsigned_int_*,_int_*,_unsigned_int_*,_int_*,_unsigned_int_*)>_>::TestInfo,_(__gnu_cxx::_Lock_policy)2>
               )._M_refcount._M_pi;
      (psVar9->
      super___shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::MainTestClass<void_(*)(const_unsigned_char_*,_int,_const_unsigned_char_*,_int,_unsigned_int_*,_int_*,_unsigned_int_*,_int_*,_unsigned_int_*)>_>::TestInfo,_(__gnu_cxx::_Lock_policy)2>
      )._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      (psVar10->
      super___shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::MainTestClass<void_(*)(const_unsigned_char_*,_int,_const_unsigned_char_*,_int,_unsigned_int_*,_int_*,_unsigned_int_*,_int_*,_unsigned_int_*)>_>::TestInfo,_(__gnu_cxx::_Lock_policy)2>
      )._M_ptr = peVar3;
      (psVar10->
      super___shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::MainTestClass<void_(*)(const_unsigned_char_*,_int,_const_unsigned_char_*,_int,_unsigned_int_*,_int_*,_unsigned_int_*,_int_*,_unsigned_int_*)>_>::TestInfo,_(__gnu_cxx::_Lock_policy)2>
      )._M_refcount._M_pi = p_Var5;
      (psVar9->
      super___shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::MainTestClass<void_(*)(const_unsigned_char_*,_int,_const_unsigned_char_*,_int,_unsigned_int_*,_int_*,_unsigned_int_*,_int_*,_unsigned_int_*)>_>::TestInfo,_(__gnu_cxx::_Lock_policy)2>
      )._M_ptr = (element_type *)0x0;
      psVar10 = psVar10 + 1;
    }
    if (psVar2 != (pointer)0x0) {
      operator_delete(psVar2);
    }
    (this->tests_).
    super__Vector_base<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::MainTestClass<void_(*)(const_unsigned_char_*,_int,_const_unsigned_char_*,_int,_unsigned_int_*,_int_*,_unsigned_int_*,_int_*,_unsigned_int_*)>_>::TestInfo>,_std::allocator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::MainTestClass<void_(*)(const_unsigned_char_*,_int,_const_unsigned_char_*,_int,_unsigned_int_*,_int_*,_unsigned_int_*,_int_*,_unsigned_int_*)>_>::TestInfo>_>_>
    ._M_impl.super__Vector_impl_data._M_start = psVar7;
    (this->tests_).
    super__Vector_base<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::MainTestClass<void_(*)(const_unsigned_char_*,_int,_const_unsigned_char_*,_int,_unsigned_int_*,_int_*,_unsigned_int_*,_int_*,_unsigned_int_*)>_>::TestInfo>,_std::allocator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::MainTestClass<void_(*)(const_unsigned_char_*,_int,_const_unsigned_char_*,_int,_unsigned_int_*,_int_*,_unsigned_int_*,_int_*,_unsigned_int_*)>_>::TestInfo>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = psVar10 + 1;
    (this->tests_).
    super__Vector_base<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::MainTestClass<void_(*)(const_unsigned_char_*,_int,_const_unsigned_char_*,_int,_unsigned_int_*,_int_*,_unsigned_int_*,_int_*,_unsigned_int_*)>_>::TestInfo>,_std::allocator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::MainTestClass<void_(*)(const_unsigned_char_*,_int,_const_unsigned_char_*,_int,_unsigned_int_*,_int_*,_unsigned_int_*,_int_*,_unsigned_int_*)>_>::TestInfo>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = psVar7 + uVar11;
  }
  else {
    (psVar1->
    super___shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::MainTestClass<void_(*)(const_unsigned_char_*,_int,_const_unsigned_char_*,_int,_unsigned_int_*,_int_*,_unsigned_int_*,_int_*,_unsigned_int_*)>_>::TestInfo,_(__gnu_cxx::_Lock_policy)2>
    )._M_ptr = peVar3;
    (psVar1->
    super___shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::MainTestClass<void_(*)(const_unsigned_char_*,_int,_const_unsigned_char_*,_int,_unsigned_int_*,_int_*,_unsigned_int_*,_int_*,_unsigned_int_*)>_>::TestInfo,_(__gnu_cxx::_Lock_policy)2>
    )._M_refcount._M_pi = p_Var5;
    (this->tests_).
    super__Vector_base<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::MainTestClass<void_(*)(const_unsigned_char_*,_int,_const_unsigned_char_*,_int,_unsigned_int_*,_int_*,_unsigned_int_*,_int_*,_unsigned_int_*)>_>::TestInfo>,_std::allocator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::MainTestClass<void_(*)(const_unsigned_char_*,_int,_const_unsigned_char_*,_int,_unsigned_int_*,_int_*,_unsigned_int_*,_int_*,_unsigned_int_*)>_>::TestInfo>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = psVar1 + 1;
  }
  if (local_60 != local_50) {
    operator_delete(local_60);
  }
  return;
}

Assistant:

void AddTestPattern(const char* test_suite_name, const char* test_base_name,
                      TestMetaFactoryBase<ParamType>* meta_factory,
                      CodeLocation code_location) {
    tests_.push_back(std::shared_ptr<TestInfo>(new TestInfo(
        test_suite_name, test_base_name, meta_factory, code_location)));
  }